

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::anon_unknown_104::ReadStringNoArena
                 (MessageLite *param_1,char *ptr,ParseContext *ctx,uint32_t param_4,
                 TcParseTableBase *param_5,ArenaStringPtr *field)

{
  ParseContext *ptr_00;
  uint32_t size_00;
  string *s;
  int size;
  ArenaStringPtr *field_local;
  TcParseTableBase *param_4_local;
  uint32_t param_3_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *param_0_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)param_1;
  size_00 = ReadSize((char **)&ctx_local);
  ptr_00 = ctx_local;
  if (ctx_local == (ParseContext *)0x0) {
    param_0_local = (MessageLite *)0x0;
  }
  else {
    s = ArenaStringPtr::MutableNoCopy_abi_cxx11_(field,(Arena *)0x0);
    param_0_local =
         (MessageLite *)
         EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,(char *)ptr_00,size_00,s);
  }
  return (char *)param_0_local;
}

Assistant:

PROTOBUF_NOINLINE
const char* ReadStringNoArena(MessageLite* /*msg*/, const char* ptr,
                              ParseContext* ctx, uint32_t /*aux_idx*/,
                              const TcParseTableBase* /*table*/,
                              ArenaStringPtr& field) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, field.MutableNoCopy(nullptr));
}